

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_conf.cc
# Opt level: O3

X509_EXTENSION * do_ext_nconf(CONF *conf,X509V3_CTX *ctx,int ext_nid,int crit,char *value)

{
  X509V3_EXT_METHOD *method;
  OPENSSL_STACK *sk;
  X509V3_EXT_S2I pXVar1;
  size_t sVar2;
  ASN1_VALUE *val;
  X509_EXTENSION *pXVar3;
  char *pcVar4;
  int reason;
  int line;
  OPENSSL_STACK *local_38;
  
  if (ext_nid == 0) {
    reason = 0x9e;
    line = 0x5f;
  }
  else {
    method = X509V3_EXT_get_nid(ext_nid);
    if (method != (X509V3_EXT_METHOD *)0x0) {
      if (method->v2i == (X509V3_EXT_V2I)0x0) {
        pXVar1 = method->s2i;
        if (pXVar1 == (X509V3_EXT_S2I)0x0) {
          pXVar1 = (X509V3_EXT_S2I)method->r2i;
          if (pXVar1 == (X509V3_EXT_S2I)0x0) {
            ERR_put_error(0x14,0,0x73,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_conf.cc"
                          ,0x91);
            pcVar4 = OBJ_nid2sn(ext_nid);
            ERR_add_error_data(2,"name=",pcVar4);
            return (X509_EXTENSION *)0x0;
          }
          if (ctx->db == (CONF *)0x0) {
            reason = 0x8b;
            line = 0x8a;
            goto LAB_0023fc86;
          }
        }
        val = (ASN1_VALUE *)(*pXVar1)(method,(v3_ext_ctx *)ctx,value);
      }
      else {
        if (*value == '@') {
          if (conf == (CONF *)0x0) {
            reason = 0x8b;
            line = 0x6d;
            goto LAB_0023fc86;
          }
          sk = (OPENSSL_STACK *)NCONF_get_section((CONF *)conf,value + 1);
          local_38 = (OPENSSL_STACK *)0x0;
        }
        else {
          sk = (OPENSSL_STACK *)X509V3_parse_list(value);
          local_38 = sk;
        }
        if ((sk == (OPENSSL_STACK *)0x0) || (sVar2 = OPENSSL_sk_num(sk), sVar2 == 0)) {
          ERR_put_error(0x14,0,0x79,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_conf.cc"
                        ,0x76);
          pcVar4 = OBJ_nid2sn(ext_nid);
          ERR_add_error_data(4,"name=",pcVar4,",section=",value);
          OPENSSL_sk_pop_free_ex(local_38,sk_CONF_VALUE_call_free_func,X509V3_conf_free);
          return (X509_EXTENSION *)0x0;
        }
        val = (ASN1_VALUE *)(*method->v2i)(method,(v3_ext_ctx *)ctx,(stack_st_CONF_VALUE *)sk);
        OPENSSL_sk_pop_free_ex(local_38,sk_CONF_VALUE_call_free_func,X509V3_conf_free);
      }
      if (val == (ASN1_VALUE *)0x0) {
        return (X509_EXTENSION *)0x0;
      }
      pXVar3 = do_ext_i2d((X509V3_EXT_METHOD *)method->it,ext_nid,crit,val);
      ASN1_item_free(val,method->it);
      return pXVar3;
    }
    reason = 0x9d;
    line = 99;
  }
LAB_0023fc86:
  ERR_put_error(0x14,0,reason,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_conf.cc"
                ,line);
  return (X509_EXTENSION *)0x0;
}

Assistant:

static X509_EXTENSION *do_ext_nconf(const CONF *conf, const X509V3_CTX *ctx,
                                    int ext_nid, int crit, const char *value) {
  const X509V3_EXT_METHOD *method;
  X509_EXTENSION *ext;
  const STACK_OF(CONF_VALUE) *nval;
  STACK_OF(CONF_VALUE) *nval_owned = NULL;
  void *ext_struc;
  if (ext_nid == NID_undef) {
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_UNKNOWN_EXTENSION_NAME);
    return NULL;
  }
  if (!(method = X509V3_EXT_get_nid(ext_nid))) {
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_UNKNOWN_EXTENSION);
    return NULL;
  }
  // Now get internal extension representation based on type
  if (method->v2i) {
    if (*value == '@') {
      // TODO(davidben): This is the only place where |X509V3_EXT_nconf|'s
      // |conf| parameter is used. All other codepaths use the copy inside
      // |ctx|. Should this be switched and then the parameter ignored?
      if (conf == NULL) {
        OPENSSL_PUT_ERROR(X509V3, X509V3_R_NO_CONFIG_DATABASE);
        return NULL;
      }
      nval = NCONF_get_section(conf, value + 1);
    } else {
      nval_owned = X509V3_parse_list(value);
      nval = nval_owned;
    }
    if (nval == NULL || sk_CONF_VALUE_num(nval) <= 0) {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_EXTENSION_STRING);
      ERR_add_error_data(4, "name=", OBJ_nid2sn(ext_nid), ",section=", value);
      sk_CONF_VALUE_pop_free(nval_owned, X509V3_conf_free);
      return NULL;
    }
    ext_struc = method->v2i(method, ctx, nval);
    sk_CONF_VALUE_pop_free(nval_owned, X509V3_conf_free);
    if (!ext_struc) {
      return NULL;
    }
  } else if (method->s2i) {
    if (!(ext_struc = method->s2i(method, ctx, value))) {
      return NULL;
    }
  } else if (method->r2i) {
    // TODO(davidben): Should this check be removed? This matches OpenSSL, but
    // r2i-based extensions do not necessarily require a config database. The
    // two built-in extensions only use it some of the time, and already handle
    // |X509V3_get_section| returning NULL.
    if (!ctx->db) {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_NO_CONFIG_DATABASE);
      return NULL;
    }
    if (!(ext_struc = method->r2i(method, ctx, value))) {
      return NULL;
    }
  } else {
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_EXTENSION_SETTING_NOT_SUPPORTED);
    ERR_add_error_data(2, "name=", OBJ_nid2sn(ext_nid));
    return NULL;
  }

  ext = do_ext_i2d(method, ext_nid, crit, ext_struc);
  ASN1_item_free(reinterpret_cast<ASN1_VALUE *>(ext_struc),
                 ASN1_ITEM_ptr(method->it));
  return ext;
}